

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_jmp_32_al(void)

{
  uint new_pc;
  
  new_pc = m68ki_read_imm_32();
  m68ki_jump(new_pc);
  if (m68ki_cpu.pc == m68ki_cpu.ppc) {
    m68ki_remaining_cycles =
         m68ki_remaining_cycles % (int)(uint)m68ki_cpu.cyc_instruction[m68ki_cpu.ir];
  }
  return;
}

Assistant:

static void m68k_op_jmp_32_al(void)
{
	m68ki_jump(EA_AL_32());
	m68ki_trace_t0();				   /* auto-disable (see m68kcpu.h) */
	if(REG_PC == REG_PPC)
		USE_ALL_CYCLES();
}